

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

void __thiscall
QtMWidgets::Section::fillValues
          (Section *this,QDateTime *current,QDateTime *min,QDateTime *max,bool updateIndex)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  QString local_3b0;
  undefined1 local_398 [8];
  QString v_9;
  int y_1;
  int finish_1;
  int local_354;
  undefined1 local_350 [4];
  int start_1;
  QString v_8;
  int y;
  int finish;
  int local_30c;
  QLocale local_308 [4];
  int start;
  QString local_300;
  int local_2e4;
  undefined8 uStack_2e0;
  int i_9;
  int local_2d4;
  QLocale local_2d0 [4];
  int m_3;
  QString local_2c8;
  int local_2ac;
  undefined8 uStack_2a8;
  int i_8;
  int local_29c;
  undefined1 local_298 [4];
  int m_2;
  QString v_7;
  int i_7;
  int m_1;
  QLocale local_260 [8];
  QString local_258;
  QLatin1Char local_23b;
  QChar local_23a;
  undefined1 local_238 [8];
  QString v_6;
  int local_214;
  int i_6;
  QDate local_200;
  QDate date_1;
  int d_2;
  QLocale local_1e0 [8];
  QString local_1d8;
  QLatin1Char local_1bb;
  QChar local_1ba;
  undefined1 local_1b8 [8];
  QString v_5;
  int local_194;
  int i_5;
  QDate local_180;
  QDate date;
  undefined1 local_168 [4];
  int d_1;
  QString v_4;
  int local_144;
  int i_4;
  undefined1 local_130 [4];
  int d;
  QString v_3;
  int i_3;
  undefined1 local_108 [4];
  int h_1;
  QString v_2;
  int i_2;
  int local_e4;
  int currentHour;
  int h;
  QString v_1;
  int i_1;
  undefined1 local_b8 [4];
  int m;
  QString v;
  int i;
  int s;
  QString local_80;
  QLatin1String local_58;
  QString local_48;
  byte local_29;
  QDateTime *pQStack_28;
  bool updateIndex_local;
  QDateTime *max_local;
  QDateTime *min_local;
  QDateTime *current_local;
  Section *this_local;
  
  local_29 = updateIndex;
  pQStack_28 = max;
  max_local = min;
  min_local = current;
  current_local = (QDateTime *)this;
  QList<QString>::clear(&this->values);
  if ((local_29 & 1) != 0) {
    this->currentIndex = -1;
  }
  TVar1 = this->type;
  if (TVar1 == AmPmSection) {
    QLatin1String::QLatin1String(&local_58,"AM");
    QString::QString(&local_48,local_58);
    QList<QString>::append(&this->values,&local_48);
    QString::~QString(&local_48);
    QLatin1String::QLatin1String((QLatin1String *)&s,"PM");
    QString::QString(&local_80,_s);
    QList<QString>::append(&this->values,&local_80);
    QString::~QString(&local_80);
    QDateTime::time();
    iVar3 = QTime::hour();
    if (iVar3 < 0xc) {
      this->currentIndex = 0;
    }
    else {
      this->currentIndex = 1;
    }
  }
  else if (TVar1 == SecondSection) {
    v.d.size._4_4_ = QDateTime::time();
    iVar3 = QTime::second();
    for (v.d.size._0_4_ = 0; (int)v.d.size < 0x3c; v.d.size._0_4_ = (int)v.d.size + 1) {
      QString::QString((QString *)local_b8);
      makeSectionValue((QString *)local_b8,(int)v.d.size,(bool)(this->zeroesAdded & 1));
      if (iVar3 == (int)v.d.size) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)local_b8);
      QString::~QString((QString *)local_b8);
    }
  }
  else if (TVar1 == MinuteSection) {
    QDateTime::time();
    iVar3 = QTime::minute();
    for (v_1.d.size._4_4_ = 0; v_1.d.size._4_4_ < 0x3c; v_1.d.size._4_4_ = v_1.d.size._4_4_ + 1) {
      QString::QString((QString *)&currentHour);
      makeSectionValue((QString *)&currentHour,v_1.d.size._4_4_,(bool)(this->zeroesAdded & 1));
      if (iVar3 == v_1.d.size._4_4_) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)&currentHour);
      QString::~QString((QString *)&currentHour);
    }
  }
  else if (TVar1 == Hour12Section) {
    v_2.d.size._4_4_ = QDateTime::time();
    local_e4 = QTime::hour();
    if (local_e4 == 0) {
      local_e4 = 0xc;
    }
    else if (0xc < local_e4) {
      local_e4 = local_e4 + -0xc;
    }
    for (v_2.d.size._0_4_ = 1; (int)v_2.d.size < 0xd; v_2.d.size._0_4_ = (int)v_2.d.size + 1) {
      QString::QString((QString *)local_108);
      makeSectionValue((QString *)local_108,(int)v_2.d.size,(bool)(this->zeroesAdded & 1));
      if (local_e4 == (int)v_2.d.size) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)local_108);
      QString::~QString((QString *)local_108);
    }
  }
  else if (TVar1 == Hour24Section) {
    QDateTime::time();
    iVar3 = QTime::hour();
    for (v_3.d.size._4_4_ = 0; v_3.d.size._4_4_ < 0x18; v_3.d.size._4_4_ = v_3.d.size._4_4_ + 1) {
      QString::QString((QString *)local_130);
      makeSectionValue((QString *)local_130,v_3.d.size._4_4_,(bool)(this->zeroesAdded & 1));
      if (iVar3 == v_3.d.size._4_4_) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)local_130);
      QString::~QString((QString *)local_130);
    }
  }
  else if (TVar1 == DaySection) {
    QDateTime::date();
    iVar3 = QDate::day();
    local_144 = 1;
    while( true ) {
      v_4.d.size = QDateTime::date();
      iVar4 = QDate::daysInMonth();
      if (iVar4 < local_144) break;
      QString::QString((QString *)local_168);
      makeSectionValue((QString *)local_168,local_144,(bool)(this->zeroesAdded & 1));
      if (((local_29 & 1) != 0) && (iVar3 == local_144)) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)local_168);
      QString::~QString((QString *)local_168);
      local_144 = local_144 + 1;
    }
  }
  else if (TVar1 == DaySectionShort) {
    date.jd = QDateTime::date();
    iVar3 = QDate::day();
    QDateTime::date();
    iVar4 = QDate::year();
    QDateTime::date();
    iVar2 = QDate::month();
    QDate::QDate(&local_180,iVar4,iVar2,1);
    local_194 = 1;
    while( true ) {
      v_5.d.size = QDateTime::date();
      iVar4 = QDate::daysInMonth();
      if (iVar4 < local_194) break;
      QString::QString((QString *)local_1b8);
      makeSectionValue((QString *)local_1b8,local_194,(bool)(this->zeroesAdded & 1));
      if (((local_29 & 1) != 0) && (iVar3 == local_194)) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QLatin1Char::QLatin1Char(&local_1bb,' ');
      QChar::QChar(&local_1ba,local_1bb);
      QString::prepend((QString *)local_1b8,local_1ba);
      QLocale::system();
      QDate::dayOfWeek();
      QLocale::dayName((int)&local_1d8,(FormatType)local_1e0);
      QString::prepend((QString *)local_1b8,&local_1d8);
      QString::~QString(&local_1d8);
      QLocale::~QLocale(local_1e0);
      QList<QString>::append(&this->values,(parameter_type)local_1b8);
      local_180.jd = QDate::addDays((longlong)&local_180);
      QString::~QString((QString *)local_1b8);
      local_194 = local_194 + 1;
    }
  }
  else if (TVar1 == DaySectionLong) {
    date_1.jd = QDateTime::date();
    iVar3 = QDate::day();
    QDateTime::date();
    iVar4 = QDate::year();
    QDateTime::date();
    iVar2 = QDate::month();
    QDate::QDate(&local_200,iVar4,iVar2,1);
    local_214 = 1;
    while( true ) {
      v_6.d.size = QDateTime::date();
      iVar4 = QDate::daysInMonth();
      if (iVar4 < local_214) break;
      QString::QString((QString *)local_238);
      makeSectionValue((QString *)local_238,local_214,(bool)(this->zeroesAdded & 1));
      if (((local_29 & 1) != 0) && (iVar3 == local_214)) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QLatin1Char::QLatin1Char(&local_23b,' ');
      QChar::QChar(&local_23a,local_23b);
      QString::prepend((QString *)local_238,local_23a);
      QLocale::system();
      QDate::dayOfWeek();
      QLocale::dayName((int)&local_258,(FormatType)local_260);
      QString::prepend((QString *)local_238,&local_258);
      QString::~QString(&local_258);
      QLocale::~QLocale(local_260);
      QList<QString>::append(&this->values,(parameter_type)local_238);
      local_200.jd = QDate::addDays((longlong)&local_200);
      QString::~QString((QString *)local_238);
      local_214 = local_214 + 1;
    }
  }
  else if (TVar1 == MonthSection) {
    QDateTime::date();
    iVar3 = QDate::month();
    for (v_7.d.size._4_4_ = 1; v_7.d.size._4_4_ < 0xd; v_7.d.size._4_4_ = v_7.d.size._4_4_ + 1) {
      QString::QString((QString *)local_298);
      makeSectionValue((QString *)local_298,v_7.d.size._4_4_,(bool)(this->zeroesAdded & 1));
      if (iVar3 == v_7.d.size._4_4_) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)local_298);
      QString::~QString((QString *)local_298);
    }
  }
  else if (TVar1 == MonthSectionShort) {
    uStack_2a8 = QDateTime::date();
    local_29c = QDate::month();
    for (local_2ac = 1; local_2ac < 0xd; local_2ac = local_2ac + 1) {
      if (local_29c == local_2ac) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QLocale::system();
      QLocale::monthName((int)&local_2c8,(FormatType)local_2d0);
      QList<QString>::append(&this->values,&local_2c8);
      QString::~QString(&local_2c8);
      QLocale::~QLocale(local_2d0);
    }
  }
  else if (TVar1 == MonthSectionLong) {
    uStack_2e0 = QDateTime::date();
    local_2d4 = QDate::month();
    for (local_2e4 = 1; local_2e4 < 0xd; local_2e4 = local_2e4 + 1) {
      if (local_2d4 == local_2e4) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QLocale::system();
      QLocale::monthName((int)&local_300,(FormatType)local_308);
      QList<QString>::append(&this->values,&local_300);
      QString::~QString(&local_300);
      QLocale::~QLocale(local_308);
    }
  }
  else if (TVar1 == YearSection) {
    QDateTime::date();
    local_30c = QDate::year();
    QDateTime::date();
    iVar3 = QDate::year();
    v_8.d.size = QDateTime::date();
    iVar4 = QDate::year();
    while (local_30c <= iVar3) {
      QString::QString((QString *)local_350);
      makeSectionValue((QString *)local_350,local_30c,(bool)(this->zeroesAdded & 1));
      if (local_30c == iVar4) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QList<QString>::append(&this->values,(parameter_type)local_350);
      local_30c = local_30c + 1;
      QString::~QString((QString *)local_350);
    }
  }
  else if (TVar1 == YearSection2Digits) {
    QDateTime::date();
    local_354 = QDate::year();
    QDateTime::date();
    iVar3 = QDate::year();
    v_9.d.size = QDateTime::date();
    iVar4 = QDate::year();
    while (local_354 <= iVar3) {
      QString::QString((QString *)local_398);
      makeSectionValue((QString *)local_398,local_354,(bool)(this->zeroesAdded & 1));
      if (local_354 == iVar4) {
        qVar5 = QList<QString>::size(&this->values);
        this->currentIndex = (int)qVar5;
      }
      QString::right((longlong)&local_3b0);
      QList<QString>::append(&this->values,&local_3b0);
      QString::~QString(&local_3b0);
      local_354 = local_354 + 1;
      QString::~QString((QString *)local_398);
    }
  }
  return;
}

Assistant:

void
Section::fillValues( const QDateTime & current,
	const QDateTime & min, const QDateTime & max,
	bool updateIndex )
{
	values.clear();

	if( updateIndex )
		currentIndex = -1;

	switch( type )
	{
		case AmPmSection :
		{
			values.append( QLatin1String( "AM" ) );
			values.append( QLatin1String( "PM" ) );

			if( current.time().hour() >= 12 )
				currentIndex = 1;
			else
				currentIndex = 0;
		}
		break;

		case SecondSection :
		{
			const int s = current.time().second();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( s == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MinuteSection :
		{
			const int m = current.time().minute();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour12Section :
		{
			int h = 0;
			int currentHour = current.time().hour();

			if( currentHour == 0 )
				h = 12;
			else if( currentHour > 12 )
				h = currentHour - 12;
			else
				h = currentHour;

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour24Section :
		{
			const int h = current.time().hour();

			for( int i = 0; i < 24; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySection :
		{
			const int d = current.date().day();

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySectionShort :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek(), QLocale::ShortFormat ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case DaySectionLong :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek() ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case MonthSection :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MonthSectionShort :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i, QLocale::ShortFormat ) );
			}
		}
		break;

		case MonthSectionLong :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i ) );
			}
		}
		break;

		case YearSection :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v );

				++start;
			}
		}
		break;

		case YearSection2Digits :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v.right( 2 ) );

				++start;
			}
		}
		break;

		default:
			break;
	}
}